

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t ismode(char *start,char *end,wchar_t *permset)

{
  char cVar1;
  char *pcVar2;
  char *p;
  wchar_t *permset_local;
  char *end_local;
  char *start_local;
  wchar_t local_4;
  
  if (start < end) {
    *permset = L'\0';
    p = start;
    while (p < end) {
      pcVar2 = p + 1;
      cVar1 = *p;
      p = pcVar2;
      if (cVar1 != '-') {
        if (cVar1 == 'R') {
LAB_002bf32d:
          *permset = *permset | 4;
        }
        else if (cVar1 == 'W') {
LAB_002bf33b:
          *permset = *permset | 2;
        }
        else {
          if (cVar1 != 'X') {
            if (cVar1 == 'r') goto LAB_002bf32d;
            if (cVar1 == 'w') goto LAB_002bf33b;
            if (cVar1 != 'x') {
              return L'\0';
            }
          }
          *permset = *permset | 1;
        }
      }
    }
    local_4 = L'\x01';
  }
  else {
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
ismode(const char *start, const char *end, int *permset)
{
	const char *p;

	if (start >= end)
		return (0);
	p = start;
	*permset = 0;
	while (p < end) {
		switch (*p++) {
		case 'r': case 'R':
			*permset |= ARCHIVE_ENTRY_ACL_READ;
			break;
		case 'w': case 'W':
			*permset |= ARCHIVE_ENTRY_ACL_WRITE;
			break;
		case 'x': case 'X':
			*permset |= ARCHIVE_ENTRY_ACL_EXECUTE;
			break;
		case '-':
			break;
		default:
			return (0);
		}
	}
	return (1);
}